

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UDateTimePatternField __thiscall
icu_63::DateTimePatternGenerator::getFieldAndWidthIndices
          (DateTimePatternGenerator *this,char *key,UDateTimePGDisplayWidth *widthP)

{
  bool bVar1;
  int iVar2;
  char *__s2;
  int32_t i;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  char cldrFieldKey [25];
  char acStack_48 [24];
  undefined1 local_30;
  
  strncpy(acStack_48,key,0x18);
  local_30 = 0;
  *widthP = UDATPG_WIDE;
  __s2 = strchr(acStack_48,0x2d);
  if (__s2 != (char *)0x0) {
    uVar5 = 2;
    do {
      iVar2 = strcmp(_ZN6icu_63L16CLDR_FIELD_WIDTHE_rel +
                     *(int *)(_ZN6icu_63L16CLDR_FIELD_WIDTHE_rel + uVar5 * 4),__s2);
      if (iVar2 == 0) {
        *widthP = (UDateTimePGDisplayWidth)uVar5;
        break;
      }
      bVar1 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
    *__s2 = '\0';
  }
  lVar3 = 0;
  piVar4 = &_ZN6icu_63L15CLDR_FIELD_NAMEE_rel;
  do {
    iVar2 = strcmp((char *)((long)&_ZN6icu_63L15CLDR_FIELD_NAMEE_rel + (long)*piVar4),acStack_48);
    if (iVar2 == 0) goto LAB_002ecc0e;
    lVar3 = lVar3 + 1;
    piVar4 = piVar4 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 0x10;
LAB_002ecc0e:
  return (UDateTimePatternField)lVar3;
}

Assistant:

UDateTimePatternField
DateTimePatternGenerator::getFieldAndWidthIndices(const char* key, UDateTimePGDisplayWidth* widthP) const {
    char cldrFieldKey[UDATPG_FIELD_KEY_MAX + 1];
    uprv_strncpy(cldrFieldKey, key, UDATPG_FIELD_KEY_MAX);
    cldrFieldKey[UDATPG_FIELD_KEY_MAX]=0; // ensure termination
    *widthP = UDATPG_WIDE;
    char* hyphenPtr = uprv_strchr(cldrFieldKey, '-');
    if (hyphenPtr) {
        for (int32_t i=UDATPG_WIDTH_COUNT-1; i>0; --i) {
            if (uprv_strcmp(CLDR_FIELD_WIDTH[i], hyphenPtr)==0) {
                *widthP=(UDateTimePGDisplayWidth)i;
                break;
            }
        }
        *hyphenPtr = 0; // now delete width portion of key
    }
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        if (uprv_strcmp(CLDR_FIELD_NAME[i],cldrFieldKey)==0) {
            return (UDateTimePatternField)i;
        }
    }
    return UDATPG_FIELD_COUNT;
}